

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QSize __thiscall QToolBarAreaLayoutInfo::minimumSize(QToolBarAreaLayoutInfo *this)

{
  bool bVar1;
  QSize QVar2;
  int iVar3;
  Representation RVar4;
  Representation RVar5;
  long lVar6;
  int i;
  ulong uVar7;
  QToolBarAreaLayoutLine *this_00;
  int iVar8;
  
  lVar6 = 0;
  iVar8 = 0;
  iVar3 = 0;
  for (uVar7 = 0; uVar7 < (ulong)(this->lines).d.size; uVar7 = uVar7 + 1) {
    this_00 = (QToolBarAreaLayoutLine *)((long)&(((this->lines).d.ptr)->rect).x1.m_i + lVar6);
    bVar1 = QToolBarAreaLayoutLine::skip(this_00);
    if (!bVar1) {
      QVar2 = QToolBarAreaLayoutLine::minimumSize(this_00);
      RVar5.m_i = QVar2.ht.m_i.m_i;
      if (this->o == Horizontal) {
        RVar5.m_i = QVar2.wd.m_i.m_i;
      }
      if (iVar8 <= RVar5.m_i) {
        iVar8 = RVar5.m_i;
      }
      RVar5.m_i = QVar2.ht.m_i.m_i;
      if (this->o == Vertical) {
        RVar5.m_i = QVar2.wd.m_i.m_i;
      }
      iVar3 = RVar5.m_i + iVar3;
    }
    lVar6 = lVar6 + 0x30;
  }
  RVar5.m_i = iVar8;
  RVar4.m_i = iVar3;
  if ((this->o != Horizontal) && (RVar5.m_i = iVar3, RVar4.m_i = iVar8, this->o != Vertical)) {
    RVar5.m_i = -1;
    RVar4.m_i = iVar3;
  }
  QVar2.ht.m_i = RVar4.m_i;
  QVar2.wd.m_i = RVar5.m_i;
  return QVar2;
}

Assistant:

QSize QToolBarAreaLayoutInfo::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < lines.size(); ++i) {
        const QToolBarAreaLayoutLine &l = lines.at(i);
        if (l.skip())
            continue;

        QSize m = l.minimumSize();
        a = qMax(a, pick(o, m));
        b += perp(o, m);
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}